

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  ImGuiTableSortSpecsColumn IVar1;
  ImGuiTableSortSpecsColumn *pIVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiTableSortSpecsColumn *__dest;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  
  if (table->IsSortSpecsDirty == false) {
    __assert_fail("table->IsSortSpecsDirty",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2b2a,"void ImGui::TableSortSpecsBuild(ImGuiTable *)");
  }
  TableSortSpecsSanitize(table);
  iVar6 = (int)table->SortSpecsCount;
  iVar9 = (table->SortSpecsData).Capacity;
  if (iVar9 < iVar6) {
    if (iVar9 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar9 / 2 + iVar9;
    }
    if (iVar9 <= iVar6) {
      iVar9 = iVar6;
    }
    __dest = (ImGuiTableSortSpecsColumn *)MemAlloc((long)iVar9 << 3);
    pIVar2 = (table->SortSpecsData).Data;
    if (pIVar2 != (ImGuiTableSortSpecsColumn *)0x0) {
      memcpy(__dest,pIVar2,(long)(table->SortSpecsData).Size << 3);
      MemFree((table->SortSpecsData).Data);
    }
    (table->SortSpecsData).Data = __dest;
    (table->SortSpecsData).Capacity = iVar9;
  }
  (table->SortSpecsData).Size = iVar6;
  iVar9 = table->ColumnsCount;
  if (0 < iVar9) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      pIVar3 = (table->Columns).Data;
      if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&(pIVar3->ClipRect).Min.x + lVar4))
      {
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_internal.h"
                      ,0x217,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
      }
      IVar1 = *(ImGuiTableSortSpecsColumn *)(&pIVar3->SortOrder + lVar4);
      uVar7 = (uint)(char)IVar1;
      if (uVar7 != 0xffffffff) {
        if (((char)IVar1 < '\0') || ((table->SortSpecsData).Size <= (int)uVar7)) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.h"
                        ,0x688,
                        "T &ImVector<ImGuiTableSortSpecsColumn>::operator[](int) [T = ImGuiTableSortSpecsColumn]"
                       );
        }
        pIVar2 = (table->SortSpecsData).Data;
        uVar8 = (ulong)uVar7;
        *(undefined4 *)(pIVar2 + uVar8 * 8) = *(undefined4 *)((long)&pIVar3->UserID + lVar4);
        pIVar2[uVar8 * 8 + 4] = SUB81(lVar5,0);
        pIVar2[uVar8 * 8 + 5] = IVar1;
        pIVar2[uVar8 * 8 + 6] = *(ImGuiTableSortSpecsColumn *)(&pIVar3->SortDirection + lVar4);
        iVar9 = table->ColumnsCount;
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x68;
    } while (lVar5 < iVar9);
    iVar6 = (table->SortSpecsData).Size;
  }
  (table->SortSpecs).Specs = (table->SortSpecsData).Data;
  (table->SortSpecs).SpecsCount = iVar6;
  (table->SortSpecs).SpecsDirty = true;
  table->IsSortSpecsDirty = false;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsData.resize(table->SortSpecsCount);
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        ImGuiTableSortSpecsColumn* sort_spec = &table->SortSpecsData[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImU8)column_n;
        sort_spec->SortOrder = (ImU8)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
    }
    table->SortSpecs.Specs = table->SortSpecsData.Data;
    table->SortSpecs.SpecsCount = table->SortSpecsData.Size;
    table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
    table->IsSortSpecsDirty = false; // Mark as not dirty for us
}